

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArrayBase.cpp
# Opt level: O3

void __thiscall amrex::FabArrayBase::RB180::define(RB180 *this,FabArrayBase *fa)

{
  pointer *ppCVar1;
  undefined8 *puVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  iterator iVar6;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  long lVar9;
  bool bVar10;
  undefined8 uVar11;
  pointer ppVar12;
  bool bVar13;
  long lVar14;
  mapped_type *this_00;
  vector<amrex::FabArrayBase::CopyComTag,std::allocator<amrex::FabArrayBase::CopyComTag>> *this_01;
  _Rb_tree_node_base *p_Var15;
  int iVar16;
  map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
  *pmVar17;
  int iVar18;
  uint uVar19;
  ulong uVar20;
  int iVar21;
  int iVar22;
  uint uVar23;
  int dst_owner;
  Box bxsnd;
  Box gbx;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> isects;
  int local_164;
  ulong local_160;
  uint local_154;
  int local_150;
  int local_14c;
  Box local_148;
  Box local_128;
  BoxArray *local_108;
  map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
  *local_100;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> local_f8;
  CopyComTag local_d8;
  ulong local_98;
  int local_90;
  int local_8c;
  uint local_88;
  uint local_84;
  int local_80;
  uint local_7c;
  int local_78;
  int local_74;
  uint local_70;
  int local_6c;
  FabArrayBase *local_68;
  IntVect *local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
  *local_40;
  long local_38;
  
  iVar21 = *(int *)(ParallelContext::frames + 0xc);
  local_160 = (ulong)((long)(fa->indexArray).super_vector<int,_std::allocator<int>_>.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)(fa->indexArray).super_vector<int,_std::allocator<int>_>.
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start) >> 2;
  local_f8.
  super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.
  super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.
  super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (0 < (int)(uint)local_160) {
    local_108 = &fa->boxarray;
    local_60 = &this->m_ngrow;
    iVar3 = (this->m_domain).smallend.vect[0];
    iVar4 = (this->m_domain).smallend.vect[1];
    iVar18 = (this->m_domain).bigend.vect[1];
    local_84 = iVar3 - (this->m_ngrow).vect[0];
    local_88 = iVar3 - 1;
    local_8c = (this->m_ngrow).vect[1];
    local_90 = iVar4 - local_8c;
    local_8c = local_8c + iVar18;
    iVar22 = (this->m_ngrow).vect[2];
    local_150 = (this->m_domain).smallend.vect[2] - iVar22;
    local_154 = iVar22 + (this->m_domain).bigend.vect[2];
    iVar18 = iVar18 - iVar4;
    local_50 = (ulong)(uint)-iVar3;
    local_78 = iVar18 - local_8c;
    local_7c = ~local_84;
    local_80 = iVar18 - local_90;
    local_40 = (this->super_CommMetaData).m_SndTags._M_t.
               super___uniq_ptr_impl<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_*,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
               .
               super__Head_base<0UL,_std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_*,_false>
               ._M_head_impl;
    local_58 = (ulong)((uint)local_160 & 0x7fffffff);
    uVar20 = 0;
    local_14c = iVar21;
    local_68 = fa;
    do {
      local_38 = (long)(fa->indexArray).super_vector<int,_std::allocator<int>_>.
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start[uVar20];
      BATransformer::operator()
                (&local_128,&local_108->m_bat,
                 (Box *)(local_38 * 0x1c +
                        *(long *)&(((fa->boxarray).m_ref.
                                    super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr)->m_abox).
                                  super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                  _M_impl.super__Vector_impl_data));
      lVar14 = 0;
      do {
        iVar3 = local_128.smallend.vect[lVar14 + 1];
        if (iVar3 == (this->m_domain).smallend.vect[lVar14 + 1]) {
          local_128.smallend.vect[lVar14 + 1] = iVar3 - (this->m_ngrow).vect[lVar14 + 1];
        }
        iVar3 = local_128.bigend.vect[lVar14 + 1];
        if (iVar3 == (this->m_domain).bigend.vect[lVar14 + 1]) {
          local_128.bigend.vect[lVar14 + 1] = iVar3 + (this->m_ngrow).vect[lVar14 + 1];
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 != 2);
      uVar19 = local_128.smallend.vect[0];
      if (local_128.smallend.vect[0] <= (int)(uint)local_50) {
        uVar19 = (uint)local_50;
      }
      iVar3 = local_128.smallend.vect[1];
      if (local_128.smallend.vect[1] <= local_78) {
        iVar3 = local_78;
      }
      local_148.smallend.vect[2] = local_128.smallend.vect[2];
      if (local_128.smallend.vect[2] <= local_150) {
        local_148.smallend.vect[2] = local_150;
      }
      uVar23 = local_128.bigend.vect[0];
      if ((int)local_7c <= local_128.bigend.vect[0]) {
        uVar23 = local_7c;
      }
      iVar4 = local_128.bigend.vect[1];
      if (local_80 <= local_128.bigend.vect[1]) {
        iVar4 = local_80;
      }
      local_148.bigend.vect[2] = local_128.bigend.vect[2];
      if ((int)local_154 <= local_128.bigend.vect[2]) {
        local_148.bigend.vect[2] = local_154;
      }
      local_148.smallend.vect[0] = ~uVar23;
      local_148.smallend.vect[1] = iVar18 - iVar4;
      local_148.bigend.vect[0] = ~uVar19;
      local_148.bigend.vect[1] = iVar18 - iVar3;
      local_148.btype.itype = 0;
      local_48 = uVar20;
      if (((((int)uVar19 <= (int)uVar23) && (iVar3 <= iVar4)) &&
          (local_148.smallend.vect[2] <= local_148.bigend.vect[2])) && (local_128.btype.itype < 8))
      {
        BoxArray::intersections(local_108,&local_148,&local_f8,false,local_60);
        uVar19 = (uint)((ulong)((long)local_f8.
                                      super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_f8.
                                     super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 5);
        if (0 < (int)uVar19) {
          pmVar17 = (map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
                     *)(ulong)(uVar19 & 0x7fffffff);
          lVar14 = 0x18;
          do {
            ppVar12 = local_f8.
                      super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            uVar20 = (ulong)*(int *)((long)(&(local_f8.
                                              super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->second +
                                           -1) + lVar14);
            local_164 = *(int *)(*(long *)&(((fa->distributionMap).m_ref.
                                             super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_ptr)->m_pmap).
                                           super_vector<int,_std::allocator<int>_>.
                                           super__Vector_base<int,_std::allocator<int>_>._M_impl +
                                uVar20 * 4);
            if (local_164 != iVar21) {
              uVar19 = *(uint *)((long)(&((local_f8.
                                           super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->second).
                                         smallend + -1) + lVar14);
              local_74 = *(int *)((long)((local_f8.
                                          super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->second).
                                        smallend.vect + lVar14 + -8);
              local_6c = *(int *)((long)((local_f8.
                                          super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->second).
                                        smallend.vect + lVar14 + -0x10);
              uVar23 = *(uint *)((long)(&((local_f8.
                                           super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->second).
                                         smallend + -2) + lVar14);
              iVar21 = *(int *)((long)((local_f8.
                                        super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->second).smallend
                                      .vect + lVar14 + -0x14);
              local_70 = *(uint *)((long)((local_f8.
                                           super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->second).
                                         smallend.vect + lVar14 + -4);
              local_100 = pmVar17;
              local_98 = uVar20;
              this_00 = std::
                        map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
                        ::operator[](local_40,&local_164);
              puVar2 = (undefined8 *)((long)(ppVar12->second).smallend.vect + lVar14 + -4);
              local_d8.sbox.bigend.vect[1] = iVar18 - iVar21;
              local_d8.sbox.bigend.vect[0] = ~uVar23;
              local_d8.sbox.smallend.vect[1] = iVar18 - local_74;
              local_d8.sbox.smallend.vect[0] = ~uVar19;
              local_d8.dbox.smallend.vect._0_8_ = *(undefined8 *)((long)puVar2 + -0x14);
              uVar11 = *(undefined8 *)((long)puVar2 + -0xc);
              local_d8.dbox.bigend.vect[1] = (int)((ulong)puVar2[-1] >> 0x20);
              local_d8.dbox.bigend.vect[2] = (int)*puVar2;
              local_d8.dbox.btype.itype = (uint)((ulong)*puVar2 >> 0x20);
              local_d8.dbox.smallend.vect[2] = (int)uVar11;
              local_d8.dbox.bigend.vect[0] = (int)((ulong)uVar11 >> 0x20);
              local_d8.sbox.smallend.vect[2] = local_6c;
              local_d8.sbox.btype.itype = 0;
              local_d8.sbox.bigend.vect[2] = local_70;
              local_d8.dstIndex = (int)local_98;
              local_d8.srcIndex = (int)local_38;
              iVar6._M_current =
                   (this_00->
                   super__Vector_base<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
              if (iVar6._M_current ==
                  (this_00->
                  super__Vector_base<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
                  )._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::
                vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
                ::_M_realloc_insert<amrex::FabArrayBase::CopyComTag>(this_00,iVar6,&local_d8);
                pmVar17 = local_100;
                fa = local_68;
                iVar21 = local_14c;
              }
              else {
                *(undefined8 *)(((iVar6._M_current)->sbox).bigend.vect + 2) = local_d8.sbox._20_8_;
                (iVar6._M_current)->dstIndex = local_d8.dstIndex;
                (iVar6._M_current)->srcIndex = local_d8.srcIndex;
                *(ulong *)(((iVar6._M_current)->sbox).smallend.vect + 1) =
                     CONCAT44(local_6c,local_d8.sbox.smallend.vect[1]);
                *(ulong *)((iVar6._M_current)->sbox).bigend.vect =
                     CONCAT44(local_d8.sbox.bigend.vect[1],local_d8.sbox.bigend.vect[0]);
                *(ulong *)(((iVar6._M_current)->dbox).bigend.vect + 1) =
                     CONCAT44(local_d8.dbox.bigend.vect[2],local_d8.dbox.bigend.vect[1]);
                *(ulong *)&((iVar6._M_current)->dbox).btype =
                     CONCAT44(local_d8.sbox.smallend.vect[0],local_d8.dbox.btype.itype);
                *(undefined8 *)((iVar6._M_current)->dbox).smallend.vect =
                     local_d8.dbox.smallend.vect._0_8_;
                *(undefined8 *)(((iVar6._M_current)->dbox).smallend.vect + 2) = uVar11;
                ppCVar1 = &(this_00->
                           super__Vector_base<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
                           )._M_impl.super__Vector_impl_data._M_finish;
                *ppCVar1 = *ppCVar1 + 1;
                pmVar17 = local_100;
                fa = local_68;
                iVar21 = local_14c;
              }
            }
            lVar14 = lVar14 + 0x20;
            pmVar17 = (map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
                       *)((long)&pmVar17[-1]._M_t._M_impl.super__Rb_tree_header._M_node_count + 7);
          } while (pmVar17 !=
                   (map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
                    *)0x0);
        }
      }
      uVar20 = local_48 + 1;
    } while (uVar20 != local_58);
    if (0 < (int)(uint)local_160) {
      local_100 = (this->super_CommMetaData).m_RcvTags._M_t.
                  super___uniq_ptr_impl<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_*,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
                  .
                  super__Head_base<0UL,_std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_*,_false>
                  ._M_head_impl;
      local_160 = (ulong)((uint)local_160 & 0x7fffffff);
      uVar20 = 0;
      do {
        iVar3 = (fa->indexArray).super_vector<int,_std::allocator<int>_>.
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start[uVar20];
        local_98 = uVar20;
        BATransformer::operator()
                  (&local_d8.dbox,&local_108->m_bat,
                   (Box *)((long)iVar3 * 0x1c +
                          *(long *)&(((fa->boxarray).m_ref.
                                      super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_ptr)->m_abox).
                                    super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                    _M_impl.super__Vector_impl_data));
        iVar4 = (this->m_ngrow).vect[0];
        iVar22 = (this->m_ngrow).vect[1];
        uVar19 = local_d8.dbox.smallend.vect[0] - iVar4;
        iVar16 = local_d8.dbox.smallend.vect[1] - iVar22;
        iVar5 = (this->m_ngrow).vect[2];
        local_128.smallend.vect[2] = local_d8.dbox.smallend.vect[2] - iVar5;
        uVar23 = iVar4 + local_d8.dbox.bigend.vect[0];
        iVar22 = iVar22 + local_d8.dbox.bigend.vect[1];
        local_128.bigend.vect[2] = iVar5 + local_d8.dbox.bigend.vect[2];
        if ((int)uVar19 <= (int)local_84) {
          uVar19 = local_84;
        }
        if (iVar16 <= local_90) {
          iVar16 = local_90;
        }
        if (local_128.smallend.vect[2] <= local_150) {
          local_128.smallend.vect[2] = local_150;
        }
        if ((int)local_88 <= (int)uVar23) {
          uVar23 = local_88;
        }
        if (local_8c <= iVar22) {
          iVar22 = local_8c;
        }
        if ((int)local_154 <= local_128.bigend.vect[2]) {
          local_128.bigend.vect[2] = local_154;
        }
        local_128.smallend.vect[0] = ~uVar23;
        local_128.smallend.vect[1] = iVar18 - iVar22;
        local_128.bigend.vect[0] = ~uVar19;
        local_128.bigend.vect[1] = iVar18 - iVar16;
        local_128.btype.itype = 0;
        if ((((int)uVar19 <= (int)uVar23) && (iVar16 <= iVar22)) &&
           ((local_128.smallend.vect[2] <= local_128.bigend.vect[2] &&
            (local_d8.dbox.btype.itype < 8)))) {
          BoxArray::intersections(local_108,&local_128,&local_f8);
          uVar19 = (uint)((ulong)((long)local_f8.
                                        super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_f8.
                                       super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 5);
          if (0 < (int)uVar19) {
            uVar20 = 0;
            do {
              local_d8.srcIndex =
                   local_f8.
                   super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar20].first;
              local_148.smallend.vect._0_8_ =
                   *(undefined8 *)
                    local_f8.
                    super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar20].second.smallend.vect;
              uVar11 = *(undefined8 *)
                        (local_f8.
                         super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar20].second.smallend.vect + 2)
              ;
              local_148.bigend.vect[1] =
                   (int)((ulong)*(undefined8 *)
                                 local_f8.
                                 super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar20].second.bigend.
                                 vect >> 0x20);
              local_148._20_8_ =
                   *(ulong *)(local_f8.
                              super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar20].second.bigend.vect +
                             2);
              local_148.smallend.vect[2] = (int)uVar11;
              local_148.bigend.vect[0] = (int)((ulong)uVar11 >> 0x20);
              lVar14 = 0;
              do {
                iVar4 = local_148.smallend.vect[lVar14 + 1];
                if (iVar4 == (this->m_domain).smallend.vect[lVar14 + 1]) {
                  local_148.smallend.vect[lVar14 + 1] = iVar4 - (this->m_ngrow).vect[lVar14 + 1];
                }
                iVar4 = local_148.bigend.vect[lVar14 + 1];
                if (iVar4 == (this->m_domain).bigend.vect[lVar14 + 1]) {
                  local_148.bigend.vect[lVar14 + 1] = iVar4 + (this->m_ngrow).vect[lVar14 + 1];
                }
                lVar14 = lVar14 + 1;
              } while (lVar14 != 2);
              local_d8.dbox.smallend.vect[0] = ~local_148.bigend.vect[0];
              local_d8.dbox.smallend.vect[1] = iVar18 - local_148.bigend.vect[1];
              local_d8.dbox.bigend.vect[0] = ~local_148.smallend.vect[0];
              local_d8.dbox.bigend.vect[1] = iVar18 - local_148.smallend.vect[1];
              local_164 = *(int *)(*(long *)&(((fa->distributionMap).m_ref.
                                               super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_ptr)->m_pmap).
                                             super_vector<int,_std::allocator<int>_>.
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl +
                                  (long)local_d8.srcIndex * 4);
              local_d8.dbox.smallend.vect[2] = local_148.smallend.vect[2];
              local_d8.dbox.bigend.vect[2] = local_148.bigend.vect[2];
              local_d8.dbox.btype.itype = 0;
              local_d8.sbox.bigend.vect[1] = local_148.bigend.vect[1];
              local_d8.sbox.bigend.vect[2] = local_148.bigend.vect[2];
              local_d8.sbox.btype.itype = local_148.btype.itype;
              local_d8.sbox.smallend.vect[2] = local_148.smallend.vect[2];
              local_d8.sbox.bigend.vect[0] = local_148.bigend.vect[0];
              local_d8.sbox.smallend.vect[0] = local_148.smallend.vect[0];
              local_d8.sbox.smallend.vect[1] = local_148.smallend.vect[1];
              local_d8.dstIndex = iVar3;
              if (local_164 == iVar21) {
                this_01 = (vector<amrex::FabArrayBase::CopyComTag,std::allocator<amrex::FabArrayBase::CopyComTag>>
                           *)(this->super_CommMetaData).m_LocTags._M_t.
                             super___uniq_ptr_impl<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_*,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
                             .
                             super__Head_base<0UL,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_*,_false>
                             ._M_head_impl;
              }
              else {
                this_01 = (vector<amrex::FabArrayBase::CopyComTag,std::allocator<amrex::FabArrayBase::CopyComTag>>
                           *)std::
                             map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
                             ::operator[](local_100,&local_164);
              }
              iVar6._M_current = *(CopyComTag **)(this_01 + 8);
              if (iVar6._M_current == *(CopyComTag **)(this_01 + 0x10)) {
                std::
                vector<amrex::FabArrayBase::CopyComTag,std::allocator<amrex::FabArrayBase::CopyComTag>>
                ::_M_realloc_insert<amrex::FabArrayBase::CopyComTag_const&>(this_01,iVar6,&local_d8)
                ;
              }
              else {
                *(undefined8 *)(((iVar6._M_current)->sbox).bigend.vect + 2) = local_d8.sbox._20_8_;
                (iVar6._M_current)->dstIndex = local_d8.dstIndex;
                (iVar6._M_current)->srcIndex = local_d8.srcIndex;
                *(ulong *)(((iVar6._M_current)->sbox).smallend.vect + 1) =
                     CONCAT44(local_d8.sbox.smallend.vect[2],local_d8.sbox.smallend.vect[1]);
                *(ulong *)((iVar6._M_current)->sbox).bigend.vect =
                     CONCAT44(local_d8.sbox.bigend.vect[1],local_d8.sbox.bigend.vect[0]);
                *(ulong *)(((iVar6._M_current)->dbox).bigend.vect + 1) =
                     CONCAT44(local_d8.dbox.bigend.vect[2],local_d8.dbox.bigend.vect[1]);
                *(ulong *)&((iVar6._M_current)->dbox).btype =
                     CONCAT44(local_d8.sbox.smallend.vect[0],local_d8.dbox.btype.itype);
                *(undefined8 *)((iVar6._M_current)->dbox).smallend.vect =
                     local_d8.dbox.smallend.vect._0_8_;
                *(ulong *)(((iVar6._M_current)->dbox).smallend.vect + 2) =
                     CONCAT44(local_d8.dbox.bigend.vect[0],local_d8.dbox.smallend.vect[2]);
                *(long *)(this_01 + 8) = *(long *)(this_01 + 8) + 0x40;
              }
              uVar20 = uVar20 + 1;
            } while (uVar20 != (uVar19 & 0x7fffffff));
          }
        }
        uVar20 = local_98 + 1;
      } while (uVar20 != local_160);
    }
  }
  bVar13 = true;
  do {
    bVar10 = bVar13;
    lVar14 = *(long *)((this->m_ngrow).vect + (ulong)((byte)~bVar10 & 1) * 2 + -4);
    for (p_Var15 = *(_Rb_tree_node_base **)(lVar14 + 0x18);
        p_Var15 != (_Rb_tree_node_base *)(lVar14 + 8);
        p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15)) {
      p_Var7 = p_Var15[1]._M_parent;
      p_Var8 = p_Var15[1]._M_left;
      if (p_Var7 != p_Var8) {
        uVar20 = (long)p_Var8 - (long)p_Var7 >> 6;
        lVar9 = 0x3f;
        if (uVar20 != 0) {
          for (; uVar20 >> lVar9 == 0; lVar9 = lVar9 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<amrex::FabArrayBase::CopyComTag*,std::vector<amrex::FabArrayBase::CopyComTag,std::allocator<amrex::FabArrayBase::CopyComTag>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (p_Var7,p_Var8,((uint)lVar9 ^ 0x3f) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<amrex::FabArrayBase::CopyComTag*,std::vector<amrex::FabArrayBase::CopyComTag,std::allocator<amrex::FabArrayBase::CopyComTag>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (p_Var7,p_Var8);
      }
    }
    bVar13 = false;
  } while (bVar10);
  if (local_f8.
      super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.
                    super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_f8.
                          super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.
                          super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void
FabArrayBase::RB180::define (const FabArrayBase& fa)
{
    const int myproc = ParallelDescriptor::MyProc();
    const BoxArray& ba = fa.boxArray();
    const DistributionMapping& dm = fa.DistributionMap();
    const Vector<int>& imap = fa.IndexArray();

    const int nlocal = imap.size();
    std::vector<std::pair<int,Box> > isects;

    Box domain_dst = amrex::adjCellLo(m_domain, 0, m_ngrow[0]).grow(1, m_ngrow[1]);
#if (AMREX_SPACEDIM == 3)
    domain_dst.grow(2, m_ngrow[2]);
#endif

    auto const convert = NonLocalBC::Rotate180Fn{m_domain.length(1)};

    Box const& domain_src = convert(domain_dst);

    auto& send_tags = *m_SndTags;

    for (int i = 0; i < nlocal; ++i)
    {
        const int ksnd = imap[i];
        Box gbx = ba[ksnd];
        for (int idim = 1; idim < AMREX_SPACEDIM; ++idim) {
            if (gbx.smallEnd(idim) == m_domain.smallEnd(idim)) {
                gbx.growLo(idim, m_ngrow[idim]);
            }
            if (gbx.bigEnd(idim) == m_domain.bigEnd(idim)) {
                gbx.growHi(idim, m_ngrow[idim]);
            }
        }

        Box const& src_box = gbx & domain_src;
        Box const& dst_box = convert(src_box);

        if (src_box.ok()) {
            ba.intersections(dst_box, isects, false, m_ngrow);
            for (int j = 0, M = isects.size(); j < M; ++j) {
                const int krcv = isects[j].first;
                const Box& bxrcv = isects[j].second;
                const int dst_owner = dm[krcv];
                if (dst_owner != myproc) // local copy will be dealt with later
                {
                    Box const& bxsnd = convert(bxrcv);
                    send_tags[dst_owner].push_back(FabArrayBase::CopyComTag(bxrcv, bxsnd,
                                                                            krcv, ksnd));
                }
            }
        }
    }

    auto& recv_tags = *m_RcvTags;

    for (int i = 0; i < nlocal; ++i)
    {
        const int krcv = imap[i];
        Box const& gbx = amrex::grow(ba[krcv],m_ngrow);

        Box const& dst_box = gbx & domain_dst;
        Box const& src_box = convert(dst_box);

        if (dst_box.ok()) {
            ba.intersections(src_box, isects);
            for (int j = 0, M = isects.size(); j < M; ++j) {
                const int ksnd = isects[j].first;
                Box bxsnd = isects[j].second;
                // the ghost cells at lo-y, hi-y, lo-z, and hi-z
                // boundaries are also the source
                for (int idim = 1; idim < AMREX_SPACEDIM; ++idim) {
                    if (bxsnd.smallEnd(idim) == m_domain.smallEnd(idim)) {
                        bxsnd.growLo(idim, m_ngrow[idim]);
                    }
                    if (bxsnd.bigEnd(idim) == m_domain.bigEnd(idim)) {
                        bxsnd.growHi(idim, m_ngrow[idim]);
                    }
                }
                Box const& bxrcv = convert(bxsnd);
                const int src_owner = dm[ksnd];
                FabArrayBase::CopyComTag cct(bxrcv, bxsnd, krcv, ksnd);
                if (src_owner == myproc) {
                    m_LocTags->push_back(cct);
                } else {
                    recv_tags[src_owner].push_back(cct);
                }
            }
        }
    }

    for (int ipass = 0; ipass < 2; ++ipass) // pass 0: send; pass 1: recv
    {
        auto& Tags = (ipass == 0) ? *m_SndTags : *m_RcvTags;
        for (auto& kv : Tags)
        {
            auto& cctv = kv.second;
            // We need to fix the order so that the send and recv processes match.
            std::sort(cctv.begin(), cctv.end());
        }
    }
}